

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O3

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CCallMethodExp *exp)

{
  initializer_list<INode_*> __l;
  ChildrenAnswers answers;
  vector<INode_*,_std::allocator<INode_*>_> children;
  allocator_type local_c1;
  vector<INode_*,_std::allocator<INode_*>_> local_c0;
  string local_a8;
  ChildrenAnswers local_88;
  ChildrenAnswers local_58;
  vector<INode_*,_std::allocator<INode_*>_> local_28;
  
  local_88.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(exp->objectExpression)._M_t.
                super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  local_88.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(exp->methodName)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>.
                _M_t.super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  local_88.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(exp->args)._M_t.super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>.
                _M_t.super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>.
                super__Head_base<0UL,_CExpList_*,_false>._M_head_impl;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_88;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&local_28,__l,&local_c1);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&local_c0,&local_28);
  VisitChildren(&local_88,this,&local_c0);
  if (local_c0.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58.descriptions,&local_88.descriptions);
  std::vector<int,_std::allocator<int>_>::vector(&local_58.ids,&local_88.ids);
  AddChildrenAnswers(this,&local_58);
  if (local_58.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.descriptions);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"CallMethod","");
  AddLabel(this,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  this->lastVisited = this->lastVisited + 1;
  if (local_88.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88.descriptions);
  if (local_28.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CPrintVisitor::Visit(CCallMethodExp &exp)
{
	std::vector<INode*> children = { exp.objectExpression.get(), exp.methodName.get(), exp.args.get() };
	ChildrenAnswers answers = VisitChildren(children);
	AddChildrenAnswers(answers);
	AddLabel("CallMethod");
	++lastVisited;	
}